

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock.h
# Opt level: O1

Result __thiscall
testing::internal::FunctionMockerBase<__locale_struct_*(int,_const_char_*,___locale_struct_*)>::
PerformDefaultAction
          (FunctionMockerBase<__locale_struct_*(int,_const_char_*,___locale_struct_*)> *this,
          ArgumentTuple *args,string *call_description)

{
  pointer pcVar1;
  bool bVar2;
  Action<__locale_struct_*(int,_const_char_*,___locale_struct_*)> *this_00;
  Result p_Var3;
  Result p_Var4;
  __normal_iterator<const_void_*const_*,_std::vector<const_void_*,_std::allocator<const_void_*>_>_>
  __tmp;
  pointer ppvVar5;
  OnCallSpec<__locale_struct_*(int,_const_char_*,___locale_struct_*)> *this_01;
  string message;
  undefined1 *local_50 [2];
  undefined1 local_40 [16];
  
  ppvVar5 = (this->super_UntypedFunctionMockerBase).untyped_on_call_specs_.
            super__Vector_base<const_void_*,_std::allocator<const_void_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  do {
    if (ppvVar5 ==
        (this->super_UntypedFunctionMockerBase).untyped_on_call_specs_.
        super__Vector_base<const_void_*,_std::allocator<const_void_*>_>._M_impl.
        super__Vector_impl_data._M_start) {
      this_01 = (OnCallSpec<__locale_struct_*(int,_const_char_*,___locale_struct_*)> *)0x0;
      break;
    }
    this_01 = (OnCallSpec<__locale_struct_*(int,_const_char_*,___locale_struct_*)> *)ppvVar5[-1];
    ppvVar5 = ppvVar5 + -1;
    bVar2 = OnCallSpec<__locale_struct_*(int,_const_char_*,___locale_struct_*)>::Matches
                      (this_01,args);
  } while (!bVar2);
  if (this_01 != (OnCallSpec<__locale_struct_*(int,_const_char_*,___locale_struct_*)> *)0x0) {
    this_00 = OnCallSpec<__locale_struct_*(int,_const_char_*,___locale_struct_*)>::GetAction
                        (this_01);
    p_Var3 = Action<__locale_struct_*(int,_const_char_*,___locale_struct_*)>::Perform(this_00,args);
    return p_Var3;
  }
  pcVar1 = (call_description->_M_dataplus)._M_p;
  local_50[0] = local_40;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_50,pcVar1,pcVar1 + call_description->_M_string_length);
  std::__cxx11::string::append((char *)local_50);
  if (DefaultValue<__locale_struct*>::value_ == (undefined8 *)0x0) {
    p_Var4 = (Result)0x0;
  }
  else {
    p_Var4 = (Result)*DefaultValue<__locale_struct*>::value_;
  }
  if (local_50[0] != local_40) {
    operator_delete(local_50[0]);
  }
  return p_Var4;
}

Assistant:

Result PerformDefaultAction(const ArgumentTuple& args,
                              const string& call_description) const {
    const OnCallSpec<F>* const spec =
        this->FindOnCallSpec(args);
    if (spec != NULL) {
      return spec->GetAction().Perform(args);
    }
    const string message = call_description +
        "\n    The mock function has no default action "
        "set, and its return type has no default value set.";
#if GTEST_HAS_EXCEPTIONS
    if (!DefaultValue<Result>::Exists()) {
      throw std::runtime_error(message);
    }
#else
    Assert(DefaultValue<Result>::Exists(), "", -1, message);
#endif
    return DefaultValue<Result>::Get();
  }